

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepsBuildEngineTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_67cc9::DepsBuildEngineTest_KeysWithNull_Test::
~DepsBuildEngineTest_KeysWithNull_Test(DepsBuildEngineTest_KeysWithNull_Test *this)

{
  DepsBuildEngineTest_KeysWithNull_Test *this_local;
  
  ~DepsBuildEngineTest_KeysWithNull_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DepsBuildEngineTest, KeysWithNull) {
  // Check build engine support for keys with embedded null characters.
  std::vector<std::string> builtKeys;
  SimpleBuildEngineDelegate delegate;

  // Create a temporary file.
  llvm::SmallString<256> dbPath;
  auto ec = llvm::sys::fs::createTemporaryFile("build", "db", dbPath);
  EXPECT_EQ(bool(ec), false);

  fprintf(stderr, "using db: %s\n", dbPath.c_str());
  for (int iteration = 0; iteration < 2; ++iteration) {
    fprintf(stderr, "iteration: %d\n", iteration);
    
    core::BuildEngine engine(delegate);

    // Attach the database.
    {
      std::string error;
      auto db = createSQLiteBuildDB(dbPath, 1, /* recreateUnmatchedVersion = */ true, &error);
      EXPECT_EQ(bool(db), true);
      if (!db) {
        fprintf(stderr, "unable to open database: %s\n", error.c_str());
        return;
      }
      engine.attachDB(std::move(db), &error);
    }

    std::string inputA{"i\0A", 3};
    std::string inputB{"i\0B", 3};
    engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
        inputA, {}, [&] (const std::vector<int>& inputs) {
            builtKeys.push_back(inputA);
            return 2; })));
    engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
        inputB, {}, [&] (const std::vector<int>& inputs) {
            builtKeys.push_back(inputB);
            return 3; })));
    engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
        "output", { inputA, inputB }, [&] (const std::vector<int>& inputs) {
            assert(inputs.size() == 2);
            builtKeys.push_back("output");
            return inputs[0] * inputs[1]; })));

    // Run the build.
    builtKeys.clear();
    EXPECT_EQ(2 * 3, intFromValue(engine.build("output")));
    if (iteration == 0) {
      EXPECT_EQ(3U, builtKeys.size());
      EXPECT_EQ(inputA, builtKeys[0]);
      EXPECT_EQ(inputB, builtKeys[1]);
      EXPECT_EQ("output", builtKeys[2]);
    } else {
      EXPECT_EQ(0U, builtKeys.size());
    }
  }

  ec = llvm::sys::fs::remove(dbPath.str());
  EXPECT_EQ(bool(ec), false);
}